

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *dst,
               Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *lhs,
               Matrix<double,__1,__1,_0,__1,__1> *rhs,Scalar *alpha)

{
  double dVar1;
  long lVar2;
  char *__function;
  double dVar3;
  Transpose<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> destT;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_b8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_40;
  
  if ((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 1)
  {
    local_c0.m_matrix.m_matrix = (non_const_type)lhs->m_matrix;
    local_b8.m_lhs.m_matrix.
    super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
    .m_data = (PointerType)dst->m_matrix;
    local_40.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d._0_8_ = rhs;
    gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>>
              ((Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_40,&local_c0,
               (Transpose<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_b8,
               alpha);
    return;
  }
  local_b8.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
  .m_xpr.m_matrix = lhs->m_matrix;
  local_b8.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
  .m_data = ((local_b8.m_lhs.m_matrix.
              super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
              .m_xpr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_data;
  local_b8.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
  .m_cols.m_value =
       ((local_b8.m_lhs.m_matrix.
         super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
         .m_xpr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
       .m_rows;
  if (local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
      .m_cols.m_value < 0 &&
      local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
      .m_data != (double *)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 1, -1, true>, Level = 0]"
    ;
  }
  else {
    local_b8.m_rhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
    m_data = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar2 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    if (-1 < lVar2 ||
        local_b8.m_rhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_data == (double *)0x0) {
      if (local_b8.m_lhs.m_matrix.
          super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
          .m_cols.m_value != lVar2) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 1, -1, true>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 1, -1, true>, OtherDerived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
                     );
      }
      dVar1 = *alpha;
      local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
      .m_startCol.m_value = 0;
      local_b8.m_rhs.
      super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_b8.m_rhs.
      super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_startCol.m_value = 0;
      if (local_b8.m_lhs.m_matrix.
          super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
          .m_cols.m_value == 0) {
        dVar3 = 0.0;
      }
      else {
        local_b8.m_lhs.m_matrix.
        super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
        .
        super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
        .m_outerStride =
             local_b8.m_lhs.m_matrix.
             super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
             .m_cols.m_value;
        local_b8.m_rhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
        m_rows.m_value =
             local_b8.m_lhs.m_matrix.
             super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
             .m_cols.m_value;
        local_b8.m_rhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_xpr = rhs;
        local_b8.m_rhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride =
             local_b8.m_lhs.m_matrix.
             super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
             .m_cols.m_value;
        if (local_b8.m_lhs.m_matrix.
            super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
            .m_cols.m_value < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>_>
        .
        super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
        .m_argImpl.
        super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>
        .
        super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
        .
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
        .m_data = local_b8.m_lhs.m_matrix.
                  super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
                  .m_data;
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>_>
        .
        super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
        .m_argImpl.
        super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>
        .
        super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
        .
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
        .m_outerStride.m_value =
             local_b8.m_lhs.m_matrix.
             super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
             .m_cols.m_value;
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_data = local_b8.m_rhs.
                  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data;
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value =
             local_b8.m_lhs.m_matrix.
             super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
             .m_cols.m_value;
        dVar3 = redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>,3,0>
                ::
                run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                          (&local_40,(scalar_sum_op<double,_double> *)&local_c0,&local_b8);
      }
      (dst->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
      .array[0] = dVar1 * dVar3 +
                  (dst->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[0];
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }